

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<int,_3UL>_> *value)

{
  bool bVar1;
  undefined1 local_30 [8];
  int3 v;
  optional<std::array<int,_3UL>_> *value_local;
  AsciiParser *this_local;
  
  unique0x10000064 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<int,_3UL>_>::operator=(stack0xffffffffffffffe0);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(int3 *)local_30);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<int,3ul>>::operator=
                ((optional<std::array<int,3ul>> *)stack0xffffffffffffffe0,
                 (array<int,_3UL> *)local_30);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::int3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::int3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}